

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void localstat(LexState *ls)

{
  FuncState *fs_00;
  int iVar1;
  int iVar2;
  TString *name;
  Vardesc *pVVar3;
  undefined1 local_50 [8];
  expdesc e;
  int nexps;
  int nvars;
  int kind;
  int vidx;
  Vardesc *var;
  int toclose;
  FuncState *fs;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  var._4_4_ = -1;
  e.f = 0;
  do {
    name = str_checkname(ls);
    iVar1 = new_localvar(ls,name);
    iVar2 = getlocalattribute(ls);
    pVVar3 = getlocalvardesc(fs_00,iVar1);
    (pVVar3->vd).kind = (lu_byte)iVar2;
    if (iVar2 == 2) {
      if (var._4_4_ != -1) {
        luaK_semerror(ls,"multiple to-be-closed variables in local list");
      }
      var._4_4_ = (uint)fs_00->nactvar + e.f;
    }
    e.f = e.f + 1;
    iVar2 = testnext(ls,0x2c);
  } while (iVar2 != 0);
  iVar2 = testnext(ls,0x3d);
  if (iVar2 == 0) {
    local_50._0_4_ = VVOID;
    e.t = 0;
  }
  else {
    e.t = explist(ls,(expdesc *)local_50);
  }
  pVVar3 = getlocalvardesc(fs_00,iVar1);
  if ((e.f == e.t) && ((pVVar3->vd).kind == '\x01')) {
    iVar1 = luaK_exp2const(fs_00,(expdesc *)local_50,&pVVar3->k);
    if (iVar1 != 0) {
      (pVVar3->vd).kind = '\x03';
      adjustlocalvars(ls,e.f + -1);
      fs_00->nactvar = fs_00->nactvar + '\x01';
      goto LAB_00152237;
    }
  }
  adjust_assign(ls,e.f,e.t,(expdesc *)local_50);
  adjustlocalvars(ls,e.f);
LAB_00152237:
  checktoclose(fs_00,var._4_4_);
  return;
}

Assistant:

static void localstat (LexState *ls) {
  /* stat -> LOCAL NAME ATTRIB { ',' NAME ATTRIB } ['=' explist] */
  FuncState *fs = ls->fs;
  int toclose = -1;  /* index of to-be-closed variable (if any) */
  Vardesc *var;  /* last variable */
  int vidx, kind;  /* index and kind of last variable */
  int nvars = 0;
  int nexps;
  expdesc e;
  do {
    vidx = new_localvar(ls, str_checkname(ls));
    kind = getlocalattribute(ls);
    getlocalvardesc(fs, vidx)->vd.kind = kind;
    if (kind == RDKTOCLOSE) {  /* to-be-closed? */
      if (toclose != -1)  /* one already present? */
        luaK_semerror(ls, "multiple to-be-closed variables in local list");
      toclose = fs->nactvar + nvars;
    }
    nvars++;
  } while (testnext(ls, ','));
  if (testnext(ls, '='))
    nexps = explist(ls, &e);
  else {
    e.k = VVOID;
    nexps = 0;
  }
  var = getlocalvardesc(fs, vidx);  /* get last variable */
  if (nvars == nexps &&  /* no adjustments? */
      var->vd.kind == RDKCONST &&  /* last variable is const? */
      luaK_exp2const(fs, &e, &var->k)) {  /* compile-time constant? */
    var->vd.kind = RDKCTC;  /* variable is a compile-time constant */
    adjustlocalvars(ls, nvars - 1);  /* exclude last variable */
    fs->nactvar++;  /* but count it */
  }
  else {
    adjust_assign(ls, nvars, nexps, &e);
    adjustlocalvars(ls, nvars);
  }
  checktoclose(fs, toclose);
}